

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_RebuildCache
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  int iVar1;
  undefined4 extraout_var;
  string *__x;
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  allocator<char> local_e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  GlobalTargetInfo local_a8;
  
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x20])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    local_a8.Name._M_dataplus._M_p = (pointer)&local_a8.Name.field_2;
    local_a8.Name._M_string_length = 0;
    local_a8.Name.field_2._M_local_buf[0] = '\0';
    local_a8.Message._M_dataplus._M_p = (pointer)&local_a8.Message.field_2;
    local_a8.Message._M_string_length = 0;
    local_a8.Message.field_2._M_local_buf[0] = '\0';
    local_a8.WorkingDir._M_dataplus._M_p = (pointer)&local_a8.WorkingDir.field_2;
    local_a8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.WorkingDir._M_string_length = 0;
    local_a8.WorkingDir.field_2._M_local_buf[0] = '\0';
    local_a8.UsesTerminal = false;
    std::__cxx11::string::assign((char *)&local_a8);
    std::__cxx11::string::assign((char *)&local_a8.Message);
    local_a8.UsesTerminal = true;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __x = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_e8,__x);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"-S$(CMAKE_SOURCE_DIR)",&local_e9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               &local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"-B$(CMAKE_BINARY_DIR)",&local_e9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e8,
               &local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&local_a8.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (cmCustomCommandLine *)&local_e8);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(targets,&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    GlobalTargetInfo::~GlobalTargetInfo(&local_a8);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_RebuildCache(
  std::vector<GlobalTargetInfo>& targets)
{
  const char* rebuildCacheTargetName = this->GetRebuildCacheTargetName();
  if (!rebuildCacheTargetName) {
    return;
  }
  GlobalTargetInfo gti;
  gti.Name = rebuildCacheTargetName;
  gti.Message = "Running CMake to regenerate build system...";
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCMakeCommand());
  singleLine.push_back("-S$(CMAKE_SOURCE_DIR)");
  singleLine.push_back("-B$(CMAKE_BINARY_DIR)");
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}